

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VdbeMemZeroTerminateIfAble(Mem *pMem)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  
  if ((pMem->flags & 0x6202) != 2) {
    return;
  }
  if (pMem->enc != '\x01') {
    return;
  }
  pcVar4 = pMem->z;
  if (pcVar4 == (char *)0x0) {
    return;
  }
  if ((pMem->flags >> 0xc & 1) == 0) {
    iVar3 = pMem->n;
    if (pMem->szMalloc <= iVar3) {
      return;
    }
LAB_00125725:
    pcVar4[iVar3] = '\0';
  }
  else {
    if (pMem->xDel == sqlite3_free) {
      uVar2 = (*sqlite3Config.m.xSize)(pcVar4);
      iVar3 = pMem->n;
      if (iVar3 + 1U <= uVar2) {
        pcVar4 = pMem->z;
        goto LAB_00125725;
      }
    }
    if (pMem->xDel != sqlite3RCStrUnref) {
      return;
    }
  }
  pbVar1 = (byte *)((long)&pMem->flags + 1);
  *pbVar1 = *pbVar1 | 2;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemZeroTerminateIfAble(Mem *pMem){
  if( (pMem->flags & (MEM_Str|MEM_Term|MEM_Ephem|MEM_Static))!=MEM_Str ){
    /* pMem must be a string, and it cannot be an ephemeral or static string */
    return;
  }
  if( pMem->enc!=SQLITE_UTF8 ) return;
  if( NEVER(pMem->z==0) ) return;
  if( pMem->flags & MEM_Dyn ){
    if( pMem->xDel==sqlite3_free
     && sqlite3_msize(pMem->z) >= (u64)(pMem->n+1)
    ){
      pMem->z[pMem->n] = 0;
      pMem->flags |= MEM_Term;
      return;
    }
    if( pMem->xDel==sqlite3RCStrUnref ){
      /* Blindly assume that all RCStr objects are zero-terminated */
      pMem->flags |= MEM_Term;
      return;
    }
  }else if( pMem->szMalloc >= pMem->n+1 ){
    pMem->z[pMem->n] = 0;
    pMem->flags |= MEM_Term;
    return;
  }
}